

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O0

void amrex::Multiply<amrex::FArrayBox,void>
               (FabArray<amrex::FArrayBox> *dst,FabArray<amrex::FArrayBox> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  bool bVar1;
  int in_ECX;
  long lVar2;
  int in_EDX;
  FabArray<amrex::FArrayBox> *in_RDI;
  int in_R8D;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> dstFab;
  Array4<const_double> srcFab;
  Box *bx;
  MFIter mfi;
  MFIter *in_stack_fffffffffffffd90;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  undefined8 in_stack_fffffffffffffdb0;
  undefined1 do_tiling_;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  MFIter *in_stack_fffffffffffffdd0;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  Box local_18c;
  Box *local_170;
  MFIter local_168;
  int local_fc;
  int local_f8;
  int local_f4;
  MFIter *local_e0;
  int local_d8;
  Box *local_d0;
  int local_c4;
  int iStack_c0;
  int local_bc;
  undefined8 local_b8;
  int local_b0;
  Box *local_a8;
  int local_9c;
  int iStack_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  Box *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  Box *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
  local_fc = in_R8D;
  local_f8 = in_ECX;
  local_f4 = in_EDX;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (bool)do_tiling_);
  while (bVar1 = MFIter::isValid(&local_168), bVar1) {
    MFIter::growntilebox
              (in_stack_fffffffffffffdd0,
               (IntVect *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_170 = &local_18c;
    bVar1 = Box::ok(local_170);
    if (bVar1) {
      in_stack_fffffffffffffd90 = &local_168;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffffd90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffffd90);
      local_d0 = local_170;
      local_8 = local_170;
      local_c = 0;
      local_c4 = (local_170->smallend).vect[0];
      local_18 = local_170;
      local_1c = 1;
      iStack_c0 = (local_170->smallend).vect[1];
      in_stack_fffffffffffffdd0 = *(MFIter **)(local_170->smallend).vect;
      local_28 = local_170;
      local_2c = 2;
      local_d8 = (local_170->smallend).vect[2];
      local_a8 = local_170;
      local_38 = &local_170->bigend;
      local_3c = 0;
      local_9c = local_38->vect[0];
      local_48 = &local_170->bigend;
      local_4c = 1;
      in_stack_fffffffffffffdc8 = (local_170->bigend).vect[1];
      local_b8 = *(undefined8 *)local_38->vect;
      local_58 = &local_170->bigend;
      local_5c = 2;
      in_stack_fffffffffffffdcc = (local_170->bigend).vect[2];
      for (local_254 = 0; local_258 = local_d8, local_e0 = in_stack_fffffffffffffdd0,
          local_bc = local_d8, local_b0 = in_stack_fffffffffffffdcc,
          iStack_98 = in_stack_fffffffffffffdc8, local_94 = in_stack_fffffffffffffdcc,
          local_254 < local_fc; local_254 = local_254 + 1) {
        for (; local_25c = iStack_c0, local_258 <= in_stack_fffffffffffffdcc;
            local_258 = local_258 + 1) {
          for (; local_260 = local_c4, local_25c <= in_stack_fffffffffffffdc8;
              local_25c = local_25c + 1) {
            for (; local_260 <= local_9c; local_260 = local_260 + 1) {
              local_84 = local_260;
              local_88 = local_25c;
              local_8c = local_258;
              local_90 = local_254 + local_f4;
              local_80 = &local_1d0;
              local_6c = local_260;
              local_70 = local_25c;
              local_74 = local_258;
              local_78 = local_254 + local_f8;
              local_68 = &local_210;
              lVar2 = (long)(local_260 - local_1f0) + (local_25c - local_1ec) * local_208 +
                      (local_258 - local_1e8) * local_200 + local_78 * local_1f8;
              *(double *)(local_210 + lVar2 * 8) =
                   *(double *)
                    (local_1d0 +
                    ((long)(local_260 - local_1b0) + (local_25c - local_1ac) * local_1c8 +
                     (local_258 - local_1a8) * local_1c0 + local_90 * local_1b8) * 8) *
                   *(double *)(local_210 + lVar2 * 8);
            }
          }
        }
      }
    }
    MFIter::operator++(&local_168);
  }
  MFIter::~MFIter(in_stack_fffffffffffffd90);
  return;
}

Assistant:

void
Multiply (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstfa = dst.arrays();
        auto const& srcfa = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstfa[box_no](i,j,k,n+dstcomp) *= srcfa[box_no](i,j,k,n+srccomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,n+dstcomp) *= srcFab(i,j,k,n+srccomp);
                });
            }
        }
    }
}